

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

IVal * __thiscall
vkt::shaderexecutor::
ApplyVar<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void>_>
::doEvaluate(IVal *__return_storage_ptr__,
            ApplyVar<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void>_>
            *this,EvalContext *ctx)

{
  Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void>_>
  *this_00;
  Variable<tcu::Vector<float,_3>_> *variable;
  Variable<tcu::Vector<float,_3>_> *variable_00;
  Variable<float> *variable_01;
  Variable<vkt::shaderexecutor::Void> *variable_02;
  IVal *arg0;
  IVal *arg1;
  IVal *arg2;
  IVal *arg3;
  Variable<vkt::shaderexecutor::Void> *var3;
  Variable<float> *var2;
  Variable<tcu::Vector<float,_3>_> *var1;
  Variable<tcu::Vector<float,_3>_> *var0;
  EvalContext *ctx_local;
  ApplyVar<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void>_>
  *this_local;
  
  variable = (Variable<tcu::Vector<float,_3>_> *)
             de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_3>_>_>::operator*
                       ((SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_3>_>_> *)
                        &(this->
                         super_Apply<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void>_>
                         ).m_args);
  variable_00 = (Variable<tcu::Vector<float,_3>_> *)
                de::SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_3>_>_>::operator*
                          ((SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_3>_>_> *)
                           &(this->
                            super_Apply<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void>_>
                            ).m_args.b);
  variable_01 = (Variable<float> *)
                de::SharedPtr<const_vkt::shaderexecutor::Expr<float>_>::operator*
                          ((SharedPtr<const_vkt::shaderexecutor::Expr<float>_> *)
                           &(this->
                            super_Apply<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void>_>
                            ).m_args.c);
  variable_02 = (Variable<vkt::shaderexecutor::Void> *)
                de::SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>::
                operator*((SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_> *)
                          &(this->
                           super_Apply<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void>_>
                           ).m_args.d);
  this_00 = (this->
            super_Apply<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void>_>
            ).m_func;
  arg0 = Environment::lookup<tcu::Vector<float,3>>(ctx->env,variable);
  arg1 = Environment::lookup<tcu::Vector<float,3>>(ctx->env,variable_00);
  arg2 = Environment::lookup<float>(ctx->env,variable_01);
  arg3 = Environment::lookup<vkt::shaderexecutor::Void>(ctx->env,variable_02);
  Func<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_float,_vkt::shaderexecutor::Void>_>
  ::apply(__return_storage_ptr__,this_00,ctx,arg0,arg1,arg2,arg3);
  return __return_storage_ptr__;
}

Assistant:

IVal				doEvaluate		(const EvalContext& ctx) const
	{
		const Variable<Arg0>&	var0 = static_cast<const Variable<Arg0>&>(*this->m_args.a);
		const Variable<Arg1>&	var1 = static_cast<const Variable<Arg1>&>(*this->m_args.b);
		const Variable<Arg2>&	var2 = static_cast<const Variable<Arg2>&>(*this->m_args.c);
		const Variable<Arg3>&	var3 = static_cast<const Variable<Arg3>&>(*this->m_args.d);
		return this->m_func.apply(ctx,
								  ctx.env.lookup(var0), ctx.env.lookup(var1),
								  ctx.env.lookup(var2), ctx.env.lookup(var3));
	}